

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::decodeField
          (JsonCodec *this,Field fieldSchema,Reader fieldValue,Orphanage orphanage,Builder output)

{
  Field field;
  Field field_00;
  StructSchema SVar1;
  StructDataBitCount SVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  Type type;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Orphan<capnp::DynamicValue> local_68;
  
  type = StructSchema::Field::getType(&fieldSchema);
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  find<capnp::StructSchema::Field&>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)&local_68,
             (Field *)&((this->impl).ptr)->fieldHandlers);
  uVar6 = fieldSchema.proto._reader._44_4_;
  iVar5 = fieldSchema.proto._reader.nestingLimit;
  uVar3 = fieldSchema.proto._reader._36_4_;
  SVar2 = fieldSchema.proto._reader.dataSize;
  SVar1 = fieldSchema.parent;
  uVar13 = SUB84(fieldSchema.proto._reader.data,0);
  uVar14 = (undefined4)((ulong)fieldSchema.proto._reader.data >> 0x20);
  uVar15 = SUB84(fieldSchema.proto._reader.pointers,0);
  uVar16 = (undefined4)((ulong)fieldSchema.proto._reader.pointers >> 0x20);
  uVar9 = SUB84(fieldSchema.proto._reader.segment,0);
  uVar10 = (undefined4)((ulong)fieldSchema.proto._reader.segment >> 0x20);
  uVar11 = SUB84(fieldSchema.proto._reader.capTable,0);
  uVar12 = (undefined4)((ulong)fieldSchema.proto._reader.capTable >> 0x20);
  uVar7 = fieldSchema.index;
  uVar8 = fieldSchema._12_4_;
  if ((undefined8 *)local_68._0_8_ == (undefined8 *)0x0) {
    if ((fieldValue._reader.dataSize < 0x10) || (*fieldValue._reader.data == 0)) {
      if (((undefined1  [16])type & (undefined1  [16])0xff0000) != (undefined1  [16])0x0) {
        return;
      }
      if ((type.baseType < INTERFACE) && ((0x13000U >> (type._0_4_ & 0x1f) & 1) != 0)) {
        return;
      }
    }
    field_00.proto._reader.pointerCount = fieldSchema.proto._reader.pointerCount;
    field_00.proto._reader._38_2_ = fieldSchema.proto._reader._38_2_;
    field_00.proto._reader.dataSize = fieldSchema.proto._reader.dataSize;
    field_00.proto._reader._44_4_ = fieldSchema.proto._reader._44_4_;
    field_00.proto._reader.nestingLimit = fieldSchema.proto._reader.nestingLimit;
    decode(&local_68,this,fieldValue,type,orphanage);
    field_00.index = uVar7;
    field_00.parent = (StructSchema)(StructSchema)SVar1.super_Schema.raw;
    field_00._12_4_ = uVar8;
    field_00.proto._reader.segment._0_4_ = uVar9;
    field_00.proto._reader.segment._4_4_ = uVar10;
    field_00.proto._reader.capTable._0_4_ = uVar11;
    field_00.proto._reader.capTable._4_4_ = uVar12;
    field_00.proto._reader.data._0_4_ = uVar13;
    field_00.proto._reader.data._4_4_ = uVar14;
    field_00.proto._reader.pointers._0_4_ = uVar15;
    field_00.proto._reader.pointers._4_4_ = uVar16;
    DynamicStruct::Builder::adopt(&output,field_00,&local_68);
  }
  else {
    (**(code **)(**(long **)local_68._0_8_ + 8))
              (&local_68,*(long **)local_68._0_8_,this,type._0_8_,type.field_4.schema);
    uVar4 = fieldSchema.proto._reader._36_4_;
    fieldSchema.proto._reader.pointerCount = (StructPointerCount)uVar3;
    fieldSchema.proto._reader._38_2_ = SUB42(uVar3,2);
    field.proto._reader.pointerCount = fieldSchema.proto._reader.pointerCount;
    field.proto._reader._38_2_ = fieldSchema.proto._reader._38_2_;
    field.proto._reader.dataSize = SVar2;
    field.proto._reader._44_4_ = uVar6;
    field.proto._reader.nestingLimit = iVar5;
    field.index = uVar7;
    field.parent = (StructSchema)(StructSchema)SVar1.super_Schema.raw;
    field._12_4_ = uVar8;
    field.proto._reader.segment._0_4_ = uVar9;
    field.proto._reader.segment._4_4_ = uVar10;
    field.proto._reader.capTable._0_4_ = uVar11;
    field.proto._reader.capTable._4_4_ = uVar12;
    field.proto._reader.data._0_4_ = uVar13;
    field.proto._reader.data._4_4_ = uVar14;
    field.proto._reader.pointers._0_4_ = uVar15;
    field.proto._reader.pointers._4_4_ = uVar16;
    fieldSchema.proto._reader._36_4_ = uVar4;
    DynamicStruct::Builder::adopt(&output,field,&local_68);
  }
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)((long)&local_68 + 0x18));
  return;
}

Assistant:

void JsonCodec::decodeField(StructSchema::Field fieldSchema, JsonValue::Reader fieldValue,
                            Orphanage orphanage, DynamicStruct::Builder output) const {
  auto fieldType = fieldSchema.getType();

  KJ_IF_SOME(handler, impl->fieldHandlers.find(fieldSchema)) {
    output.adopt(fieldSchema, handler->decodeBase(*this, fieldValue, fieldType, orphanage));
  } else {
    if (!isPointerToJsonNull(fieldValue, fieldType)) {
      // If the schema type is a pointer type and the json value is null, we act as if the value
      // doesn't exist.
      output.adopt(fieldSchema, decode(fieldValue, fieldType, orphanage));
    }
  }
}